

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

GBufferFilm *
pbrt::GBufferFilm::Create
          (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  Point2<int> *pPVar1;
  bool bVar2;
  int iVar3;
  PixelSensor *sensor;
  undefined4 extraout_var;
  bool writeFP16;
  Float maxComponentValue;
  FilmBaseParameters filmBaseParameters;
  bool local_cd;
  Float local_cc;
  Float local_c8;
  Float local_c4;
  FilterHandle *local_c0;
  FilmBaseParameters local_b8;
  RGBColorSpace *local_68;
  polymorphic_allocator<std::byte> local_60;
  string local_58;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  
  pPVar1 = &local_b8.pixelBounds.pMax;
  local_c8 = exposureTime;
  local_c0 = filter;
  local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  local_68 = colorSpace;
  local_60.memoryResource = alloc.memoryResource;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"maxcomponentvalue","");
  local_c4 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_b8,INFINITY);
  if (local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    local_cc = local_c4;
    operator_delete((void *)local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_b8.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
    local_c4 = local_cc;
  }
  local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"savefp16","");
  local_cd = ParameterDictionary::GetOneBool(parameters,(string *)&local_b8,true);
  if (local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    operator_delete((void *)local_b8.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_b8.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
  }
  sensor = PixelSensor::Create(parameters,colorSpace,local_c8,loc,alloc);
  local_38.bits =
       (local_c0->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters(&local_b8,parameters,(FilterHandle *)&local_38,sensor,loc);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"exr","");
  bVar2 = HasExtension(&local_b8.filename,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xa8,8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    construct<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (&local_60,(GBufferFilm *)CONCAT44(extraout_var,iVar3),&local_b8,&local_68,&local_c4,
               &local_cd,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.filename._M_dataplus._M_p != &local_b8.filename.field_2) {
      operator_delete(local_b8.filename._M_dataplus._M_p,
                      local_b8.filename.field_2._M_allocated_capacity + 1);
    }
    return (GBufferFilm *)CONCAT44(extraout_var,iVar3);
  }
  ErrorExit<std::__cxx11::string&>
            (loc,"%s: EXR is the only format supported by the GBufferFilm.",&local_b8.filename);
}

Assistant:

GBufferFilm *GBufferFilm::Create(const ParameterDictionary &parameters,
                                 Float exposureTime, FilterHandle filter,
                                 const RGBColorSpace *colorSpace, const FileLoc *loc,
                                 Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);

    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    if (!HasExtension(filmBaseParameters.filename, "exr"))
        ErrorExit(loc, "%s: EXR is the only format supported by the GBufferFilm.",
                  filmBaseParameters.filename);

    return alloc.new_object<GBufferFilm>(filmBaseParameters, colorSpace,
                                         maxComponentValue, writeFP16, alloc);
}